

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_memory_editor.h
# Opt level: O0

void __thiscall MemoryEditor::MemoryEditor(MemoryEditor *this)

{
  MemoryEditor *this_local;
  
  this->Open = true;
  this->ReadOnly = false;
  this->Cols = 0x10;
  this->OptShowOptions = true;
  this->OptShowDataPreview = false;
  this->OptShowHexII = false;
  this->OptShowAscii = true;
  this->OptGreyOutZeroes = true;
  this->OptUpperCaseHex = true;
  this->OptMidColsCount = 8;
  this->OptAddrDigitsCount = 0;
  this->OptFooterExtraHeight = 0.0;
  this->HighlightColor = 0x32ffffff;
  this->ReadFn = (_func_ImU8_ImU8_ptr_size_t_void_ptr *)0x0;
  this->WriteFn = (_func_void_ImU8_ptr_size_t_ImU8_void_ptr *)0x0;
  this->HighlightFn = (_func_bool_ImU8_ptr_size_t_void_ptr *)0x0;
  this->ContentsWidthChanged = false;
  this->DataEditingAddr = 0xffffffffffffffff;
  this->DataPreviewAddr = 0xffffffffffffffff;
  this->DataEditingTakeFocus = false;
  memset(this->DataInputBuf,0,0x20);
  memset(this->AddrInputBuf,0,0x20);
  this->GotoAddr = 0xffffffffffffffff;
  this->HighlightMax = 0xffffffffffffffff;
  this->HighlightMin = 0xffffffffffffffff;
  this->PreviewEndianess = 0;
  this->PreviewDataType = 4;
  return;
}

Assistant:

MemoryEditor()
    {
        // Settings
        Open = true;
        ReadOnly = false;
        Cols = 16;
        OptShowOptions = true;
        OptShowDataPreview = false;
        OptShowHexII = false;
        OptShowAscii = true;
        OptGreyOutZeroes = true;
        OptUpperCaseHex = true;
        OptMidColsCount = 8;
        OptAddrDigitsCount = 0;
        OptFooterExtraHeight = 0.0f;
        HighlightColor = IM_COL32(255, 255, 255, 50);
        ReadFn = NULL;
        WriteFn = NULL;
        HighlightFn = NULL;

        // State/Internals
        ContentsWidthChanged = false;
        DataPreviewAddr = DataEditingAddr = (size_t)-1;
        DataEditingTakeFocus = false;
        memset(DataInputBuf, 0, sizeof(DataInputBuf));
        memset(AddrInputBuf, 0, sizeof(AddrInputBuf));
        GotoAddr = (size_t)-1;
        HighlightMin = HighlightMax = (size_t)-1;
        PreviewEndianess = 0;
        PreviewDataType = ImGuiDataType_S32;
    }